

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O1

void ENGINE_load_gost_cold_9(void)

{
  fwrite("ENGINE_set_id failed\n",0x15,1,_stderr);
  return;
}

Assistant:

int populate_gost_engine(ENGINE* e) {
    int ret = 0;

    if (e == NULL)
        goto end;
    if (!ENGINE_set_id(e, engine_gost_id)) {
        fprintf(stderr, "ENGINE_set_id failed\n");
        goto end;
    }
    if (!ENGINE_set_name(e, engine_gost_name)) {
        fprintf(stderr, "ENGINE_set_name failed\n");
        goto end;
    }
    if (!create_NIDs()) {
        fprintf(stderr, "NID creation failed\n");
        goto end;
    }
    if (!ENGINE_set_digests(e, gost_digests)) {
        fprintf(stderr, "ENGINE_set_digests failed\n");
        goto end;
    }
    if (!ENGINE_set_ciphers(e, gost_ciphers)) {
        fprintf(stderr, "ENGINE_set_ciphers failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_meths(e, gost_pkey_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_meths failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_asn1_meths(e, gost_pkey_asn1_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_asn1_meths failed\n");
        goto end;
    }
    /* Control function and commands */
    if (!ENGINE_set_cmd_defns(e, gost_cmds)) {
        fprintf(stderr, "ENGINE_set_cmd_defns failed\n");
        goto end;
    }
    if (!ENGINE_set_ctrl_function(e, gost_control_func)) {
        fprintf(stderr, "ENGINE_set_ctrl_func failed\n");
        goto end;
    }
    if (!ENGINE_set_destroy_function(e, gost_engine_destroy)
        || !ENGINE_set_init_function(e, gost_engine_init)
        || !ENGINE_set_finish_function(e, gost_engine_finish)) {
        goto end;
    }

    /*
     * "register" in "register_ameth_gost" and "register_pmeth_gost" is
     * not registering in an ENGINE sense, where things are hooked into
     * OpenSSL's library.  "register_ameth_gost" and "register_pmeth_gost"
     * merely allocate and populate the method structures of this engine.
     */
    struct gost_meth_minfo *minfo = gost_meth_array;
    for (; minfo->nid; minfo++) {

        /* This skip looks temporary. */
        if (minfo->nid == NID_id_tc26_cipher_gostr3412_2015_magma_ctracpkm_omac)
            continue;

        if (!register_ameth_gost(minfo->nid, minfo->ameth, minfo->pemstr,
                minfo->info))
            goto end;
        if (!register_pmeth_gost(minfo->nid, minfo->pmeth, 0))
            goto end;
    }

    ret = 1;
  end:
    return ret;
}